

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool LargeIntRegMultiply<unsigned_long,_unsigned_int>::RegMultiply
               (uint64_t *a,uint32_t b,uint64_t *pRet)

{
  uint uVar1;
  ulong uVar2;
  uint64_t tmp;
  uint32_t aLow;
  uint32_t aHigh;
  uint64_t *pRet_local;
  uint32_t b_local;
  uint64_t *a_local;
  undefined1 local_1;
  
  uVar1 = (uint)(*a >> 0x20);
  uVar2 = *a;
  *pRet = 0;
  if (uVar1 == 0) {
    *pRet = (uVar2 & 0xffffffff) * (ulong)b;
    local_1 = true;
  }
  else {
    *pRet = (ulong)uVar1 * (ulong)b;
    if ((int)(*pRet >> 0x20) == 0) {
      *pRet = *pRet << 0x20;
      uVar2 = (uVar2 & 0xffffffff) * (ulong)b;
      *pRet = uVar2 + *pRet;
      if (*pRet < uVar2) {
        local_1 = false;
      }
      else {
        local_1 = true;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static bool RegMultiply( const std::uint64_t& a, std::uint32_t b, std::uint64_t* pRet ) SAFEINT_NOTHROW
    {
#if SAFEINT_USE_INTRINSICS || SAFEINT_HAS_INT128
        return MultiplyUint64( a, (std::uint64_t)b, pRet );
#else
        std::uint32_t aHigh = 0, aLow = 0;

        // Consider that a*b can be broken up into:
        // (aHigh * 2^32 + aLow) * b
        // => (aHigh * b * 2^32) + (aLow * b)

        aHigh = (std::uint32_t)(a >> 32);
        aLow  = (std::uint32_t)a;

        *pRet = 0;

        if(aHigh != 0)
        {
            *pRet = (std::uint64_t)aHigh * (std::uint64_t)b;

            std::uint64_t tmp = 0;

            if((std::uint32_t)(*pRet >> 32) != 0)
                return false;

            *pRet <<= 32;
            tmp = (std::uint64_t)aLow * (std::uint64_t)b;
            *pRet += tmp;

            if(*pRet < tmp)
                return false;

            return true;
        }

        *pRet = (std::uint64_t)aLow * (std::uint64_t)b;
        return true;
#endif
    }